

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O1

UBool __thiscall icu_63::UnifiedCache::_flush(UnifiedCache *this,UBool all)

{
  SharedObject *value;
  UBool UVar1;
  int iVar2;
  UHashElement *element;
  UBool UVar3;
  
  iVar2 = uhash_count_63(this->fHashtable);
  if (iVar2 < 1) {
    UVar3 = '\0';
  }
  else {
    UVar3 = '\0';
    do {
      iVar2 = iVar2 + -1;
      element = _nextElement(this);
      if ((element != (UHashElement *)0x0) &&
         ((all != '\0' || (UVar1 = _isEvictable(this,element), UVar1 != '\0')))) {
        value = (SharedObject *)(element->value).pointer;
        uhash_removeElement_63(this->fHashtable,element);
        removeSoftRef(this,value);
        UVar3 = '\x01';
      }
    } while ((element != (UHashElement *)0x0) && (iVar2 != 0));
  }
  return UVar3;
}

Assistant:

UBool UnifiedCache::_flush(UBool all) const {
    UBool result = FALSE;
    int32_t origSize = uhash_count(fHashtable);
    for (int32_t i = 0; i < origSize; ++i) {
        const UHashElement *element = _nextElement();
        if (element == nullptr) {
            break;
        }
        if (all || _isEvictable(element)) {
            const SharedObject *sharedObject =
                    (const SharedObject *) element->value.pointer;
            U_ASSERT(sharedObject->cachePtr == this);
            uhash_removeElement(fHashtable, element);
            removeSoftRef(sharedObject);    // Deletes the sharedObject when softRefCount goes to zero.
            result = TRUE;
        }
    }
    return result;
}